

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

Result __thiscall Clasp::ClaspFacade::stopStep(ClaspFacade *this,int signal,bool complete)

{
  byte bVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Event local_30 [2];
  Summary *local_28;
  
  uVar2 = (this->solve_).ptr_ & 0xfffffffffffffffe;
  if ((uVar2 == 0) || (*(char *)(uVar2 + 0x5e) == '\0')) {
    dVar6 = RealTime::getTime();
    *(undefined1 *)(((this->solve_).ptr_ & 0xfffffffffffffffe) + 0x5e) = 1;
    dVar7 = dVar6 - (this->step_).totalTime;
    (this->step_).totalTime = (double)(-(ulong)(0.0 <= dVar7) & (ulong)dVar7);
    dVar7 = ProcessTime::getTime();
    dVar8 = 0.0;
    dVar7 = dVar7 - (this->step_).cpuTime;
    (this->step_).cpuTime = (double)(-(ulong)(0.0 <= dVar7) & (ulong)dVar7);
    dVar7 = (this->step_).solveTime;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      (this->step_).solveTime = (double)(-(ulong)(0.0 <= dVar6 - dVar7) & (ulong)(dVar6 - dVar7));
      if (complete) {
        dVar6 = dVar6 - (this->step_).unsatTime;
        dVar8 = (double)(-(ulong)(0.0 <= dVar6) & (ulong)dVar6);
      }
      (this->step_).unsatTime = dVar8;
    }
    bVar5 = (this->step_).numEnum == 0;
    bVar3 = bVar5 + 5;
    if (!complete) {
      bVar3 = !bVar5;
    }
    bVar1 = bVar3 + 8;
    if (signal == 0) {
      bVar1 = bVar3;
    }
    (this->step_).result = (Result)((ushort)(signal << 8) | (ushort)bVar1);
    if ((bVar1 & 3) == 1) {
      uVar2 = *(ulong *)((((this->step_).facade)->solve_).ptr_ & 0xfffffffffffffffe) &
              0xfffffffffffffffe;
      lVar4 = uVar2 + 0x48;
      if (uVar2 == 0) {
        lVar4 = 0;
      }
      if (((*(byte *)(lVar4 + 0x23) & 4) != 0) && ((this->step_).numOptimal == 0)) {
        (this->step_).numOptimal = 1;
      }
    }
    updateStats(this);
    local_30[0] = (Event)((Event_t<Clasp::ClaspFacade::StepReady>::id_s & 0xffff) << 0xc);
    local_28 = &this->step_;
    SharedContext::report(&this->ctx,local_30);
    SharedContext::report(&this->ctx,subsystem_facade);
  }
  return (this->step_).result;
}

Assistant:

ClaspFacade::Result ClaspFacade::stopStep(int signal, bool complete) {
	if (!solved()) {
		double t = RealTime::getTime();
		solve_->solved  = true;
		step_.totalTime = diffTime(t, step_.totalTime);
		step_.cpuTime   = diffTime(ProcessTime::getTime(), step_.cpuTime);
		if (step_.solveTime) {
			step_.solveTime = diffTime(t, step_.solveTime);
			step_.unsatTime = complete ? diffTime(t, step_.unsatTime) : 0;
		}
		Result res = {uint8(0), uint8(signal)};
		if (complete) { res.flags = uint8(step_.numEnum ? Result::SAT : Result::UNSAT) | Result::EXT_EXHAUST; }
		else          { res.flags = uint8(step_.numEnum ? Result::SAT : Result::UNKNOWN); }
		if (signal)   { res.flags|= uint8(Result::EXT_INTERRUPT); }
		step_.result = res;
		if (res.sat() && step_.model()->opt && !step_.numOptimal) {
			step_.numOptimal = 1;
		}
		updateStats();
		ctx.report(StepReady(step_));
		ctx.report(Event::subsystem_facade);
	}
	return result();
}